

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_rateallocate
                   (opj_tcd_t *tcd,OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 len,
                   opj_codestream_info_t *cstr_info,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  opj_cp_t *p_cp;
  opj_tcd_tile_t *p_tile;
  opj_tcp_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_image_comp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  opj_tcd_pass_t *poVar11;
  opj_tile_info_t *poVar12;
  double dVar13;
  double thresh;
  double dVar14;
  OPJ_BOOL OVar15;
  ulong uVar16;
  double *pdVar17;
  opj_t2_t *p_t2;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  OPJ_UINT32 p_max_len;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  OPJ_UINT32 layno;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  OPJ_FLOAT64 OVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double local_3e8;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  OPJ_FLOAT64 cumdisto [100];
  
  p_cp = tcd->cp;
  p_tile = tcd->tcd_image->tiles;
  poVar5 = tcd->tcp;
  p_tile->numpix = 0;
  uVar2 = p_tile->numcomps;
  if ((ulong)uVar2 == 0) {
    dVar32 = 1.79769313486232e+308;
    dVar35 = 0.0;
    dVar31 = 0.0;
  }
  else {
    poVar6 = p_tile->comps;
    poVar7 = tcd->image->comps;
    dVar31 = 0.0;
    dVar32 = 1.79769313486232e+308;
    uVar21 = 0;
    dVar35 = 0.0;
    do {
      poVar6[uVar21].numpix = 0;
      uVar3 = poVar6[uVar21].numresolutions;
      if ((ulong)uVar3 != 0) {
        poVar8 = poVar6[uVar21].resolutions;
        uVar20 = 0;
        do {
          uVar4 = poVar8[uVar20].numbands;
          if ((ulong)uVar4 != 0) {
            uVar24 = 0;
            do {
              if (((poVar8[uVar20].bands[uVar24].x1 != poVar8[uVar20].bands[uVar24].x0) &&
                  (poVar8[uVar20].bands[uVar24].y1 != poVar8[uVar20].bands[uVar24].y0)) &&
                 (uVar18 = poVar8[uVar20].ph * poVar8[uVar20].pw, uVar18 != 0)) {
                poVar9 = poVar8[uVar20].bands[uVar24].precincts;
                uVar16 = 0;
                do {
                  uVar19 = poVar9[uVar16].ch * poVar9[uVar16].cw;
                  if (uVar19 != 0) {
                    uVar22 = 0;
                    do {
                      poVar10 = poVar9[uVar16].cblks.enc;
                      if ((ulong)poVar10[uVar22].totalpasses != 0) {
                        poVar11 = poVar10[uVar22].passes;
                        lVar23 = 0;
                        dVar30 = dVar31;
                        do {
                          iVar25 = *(int *)((long)&poVar11->rate + lVar23);
                          if (lVar23 == 0) {
                            OVar29 = poVar11->distortiondec;
                          }
                          else {
                            iVar25 = iVar25 - *(int *)((long)&poVar11[-1].rate + lVar23);
                            OVar29 = (OPJ_FLOAT64)
                                     (*(double *)((long)&poVar11->distortiondec + lVar23) -
                                     *(double *)((long)poVar11 + lVar23 + -0x10));
                          }
                          dVar31 = dVar30;
                          if (iVar25 != 0) {
                            dVar31 = (double)OVar29 / (double)iVar25;
                            dVar13 = dVar31;
                            if (dVar32 <= dVar31) {
                              dVar13 = dVar32;
                            }
                            dVar32 = dVar13;
                            if (dVar31 <= dVar30) {
                              dVar31 = dVar30;
                            }
                          }
                          lVar23 = lVar23 + 0x18;
                          dVar30 = dVar31;
                        } while ((ulong)poVar10[uVar22].totalpasses * 0x18 != lVar23);
                      }
                      iVar25 = (poVar10[uVar22].y1 - poVar10[uVar22].y0) *
                               (poVar10[uVar22].x1 - poVar10[uVar22].x0);
                      p_tile->numpix = p_tile->numpix + iVar25;
                      poVar6[uVar21].numpix = poVar6[uVar21].numpix + iVar25;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar19);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != uVar18);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar4);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar3);
      }
      dVar30 = (double)(1 << ((byte)poVar7[uVar21].prec & 0x1f)) + -1.0;
      dVar35 = dVar35 + (double)poVar6[uVar21].numpix * dVar30 * dVar30;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar2);
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    poVar12 = cstr_info->tile;
    uVar2 = tcd->tcd_tileno;
    poVar12[uVar2].numpix = p_tile->numpix;
    poVar12[uVar2].distotile = (double)p_tile->distotile;
    pdVar17 = (double *)opj_malloc((ulong)poVar5->numlayers << 3);
    poVar12[uVar2].thresh = pdVar17;
    if (pdVar17 == (double *)0x0) {
      return 0;
    }
  }
  if (poVar5->numlayers != 0) {
    uVar21 = 0;
    do {
      p_max_len = len;
      if (0.0 < (float)poVar5->rates[uVar21]) {
        fVar26 = ceilf((float)poVar5->rates[uVar21]);
        p_max_len = (uint)(long)fVar26;
        if (len <= (uint)(long)fVar26) {
          p_max_len = len;
        }
      }
      dVar30 = (double)p_tile->distotile;
      dVar13 = pow(10.0,(double)((float)poVar5->distoratio[uVar21] / 10.0));
      bVar1 = *(byte *)((long)&p_cp->m_specific_param + 0x11);
      layno = (OPJ_UINT32)uVar21;
      if (((bVar1 & 1) == 0) || ((float)poVar5->rates[uVar21] <= 0.0)) {
        local_3d8 = 0;
        uStack_3d4 = 0xbff00000;
        if ((bVar1 & 4) != 0) {
          local_3d8 = 0;
          uStack_3d4 = 0xbff00000;
          if (0.0 < (float)poVar5->distoratio[uVar21]) goto LAB_0013735e;
        }
      }
      else {
LAB_0013735e:
        p_t2 = opj_t2_create(tcd->image,p_cp);
        if (p_t2 == (opj_t2_t *)0x0) {
          local_3d8 = 0;
          uStack_3d4 = 0;
        }
        else {
          local_3e8 = 0.0;
          iVar25 = 0x80;
          dVar33 = dVar32;
          dVar36 = dVar31;
          do {
            thresh = (dVar33 + dVar36) * 0.5;
            opj_tcd_makelayer(tcd,layno,(OPJ_FLOAT64)thresh,0);
            dVar34 = thresh;
            dVar37 = dVar36;
            dVar14 = local_3e8;
            if ((*(byte *)((long)&p_cp->m_specific_param + 0x11) & 4) == 0) {
              OVar15 = opj_t2_encode_packets
                                 (p_t2,tcd->tcd_tileno,p_tile,layno + 1,dest,p_data_written,
                                  p_max_len,cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,
                                  THRESH_CALC,p_manager);
              uVar27 = SUB84(dVar33,0);
              uVar28 = (undefined4)((ulong)dVar33 >> 0x20);
              dVar36 = thresh;
              local_3e8 = thresh;
              if (OVar15 != 0) {
LAB_00137594:
                dVar34 = (double)CONCAT44(uVar28,uVar27);
                dVar37 = dVar36;
                dVar14 = local_3e8;
              }
            }
            else {
              if ((ushort)((short)*(undefined4 *)p_cp - 3U) < 4) {
                OVar15 = opj_t2_encode_packets
                                   (p_t2,tcd->tcd_tileno,p_tile,layno + 1,dest,p_data_written,
                                    p_max_len,cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,
                                    THRESH_CALC,p_manager);
                if (OVar15 == 0) goto LAB_001375a2;
                if (uVar21 == 0) {
                  OVar29 = p_tile->distolayer[0];
                }
                else {
                  OVar29 = (OPJ_FLOAT64)
                           ((double)cumdisto[layno - 1] + (double)p_tile->distolayer[uVar21]);
                }
              }
              else if (uVar21 == 0) {
                OVar29 = p_tile->distolayer[0];
              }
              else {
                OVar29 = (OPJ_FLOAT64)
                         ((double)cumdisto[layno - 1] + (double)p_tile->distolayer[uVar21]);
              }
              uVar27 = SUB84(thresh,0);
              uVar28 = (undefined4)((ulong)thresh >> 0x20);
              dVar34 = dVar33;
              dVar37 = thresh;
              dVar14 = thresh;
              if (dVar30 - dVar35 / dVar13 <= (double)OVar29) goto LAB_00137594;
            }
LAB_001375a2:
            local_3e8 = dVar14;
            iVar25 = iVar25 + -1;
            dVar33 = dVar34;
            dVar36 = dVar37;
          } while (iVar25 != 0);
          uVar20 = ~-(ulong)(local_3e8 == 0.0) & (ulong)local_3e8 |
                   (ulong)thresh & -(ulong)(local_3e8 == 0.0);
          opj_t2_destroy(p_t2);
          local_3d8 = (undefined4)uVar20;
          uStack_3d4 = (undefined4)(uVar20 >> 0x20);
        }
        if (p_t2 == (opj_t2_t *)0x0) {
          return 0;
        }
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        cstr_info->tile[tcd->tcd_tileno].thresh[uVar21] = (double)CONCAT44(uStack_3d4,local_3d8);
      }
      opj_tcd_makelayer(tcd,layno,(OPJ_FLOAT64)CONCAT44(uStack_3d4,local_3d8),1);
      if (uVar21 == 0) {
        OVar29 = p_tile->distolayer[0];
      }
      else {
        OVar29 = (OPJ_FLOAT64)((double)cumdisto[uVar21 - 1] + (double)p_tile->distolayer[uVar21]);
      }
      cumdisto[uVar21] = OVar29;
      uVar21 = uVar21 + 1;
    } while (uVar21 < poVar5->numlayers);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_tcd_rateallocate(opj_tcd_t *tcd,
                              OPJ_BYTE *dest,
                              OPJ_UINT32 * p_data_written,
                              OPJ_UINT32 len,
                              opj_codestream_info_t *cstr_info,
                              opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno, layno;
    OPJ_UINT32 passno;
    OPJ_FLOAT64 min, max;
    OPJ_FLOAT64 cumdisto[100];      /* fixed_quality */
    const OPJ_FLOAT64 K = 1;                /* 1.1; fixed_quality */
    OPJ_FLOAT64 maxSE = 0;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    min = DBL_MAX;
    max = 0;

    tcd_tile->numpix = 0;           /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
        tilec->numpix = 0;

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];

                        for (passno = 0; passno < cblk->totalpasses; passno++) {
                            opj_tcd_pass_t *pass = &cblk->passes[passno];
                            OPJ_INT32 dr;
                            OPJ_FLOAT64 dd, rdslope;

                            if (passno == 0) {
                                dr = (OPJ_INT32)pass->rate;
                                dd = pass->distortiondec;
                            } else {
                                dr = (OPJ_INT32)(pass->rate - cblk->passes[passno - 1].rate);
                                dd = pass->distortiondec - cblk->passes[passno - 1].distortiondec;
                            }

                            if (dr == 0) {
                                continue;
                            }

                            rdslope = dd / dr;
                            if (rdslope < min) {
                                min = rdslope;
                            }

                            if (rdslope > max) {
                                max = rdslope;
                            }
                        } /* passno */

                        /* fixed_quality */
                        tcd_tile->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                        tilec->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                    } /* cbklno */
                } /* precno */
            } /* bandno */
        } /* resno */

        maxSE += (((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0)
                  * ((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0))
                 * ((OPJ_FLOAT64)(tilec->numpix));
    } /* compno */

    /* index file */
    if (cstr_info) {
        opj_tile_info_t *tile_info = &cstr_info->tile[tcd->tcd_tileno];
        tile_info->numpix = tcd_tile->numpix;
        tile_info->distotile = tcd_tile->distotile;
        tile_info->thresh = (OPJ_FLOAT64 *) opj_malloc(tcd_tcp->numlayers * sizeof(
                                OPJ_FLOAT64));
        if (!tile_info->thresh) {
            /* FIXME event manager error callback */
            return OPJ_FALSE;
        }
    }

    for (layno = 0; layno < tcd_tcp->numlayers; layno++) {
        OPJ_FLOAT64 lo = min;
        OPJ_FLOAT64 hi = max;
        OPJ_UINT32 maxlen = tcd_tcp->rates[layno] > 0.0f ? opj_uint_min(((
                                OPJ_UINT32) ceil(tcd_tcp->rates[layno])), len) : len;
        OPJ_FLOAT64 goodthresh = 0;
        OPJ_FLOAT64 stable_thresh = 0;
        OPJ_UINT32 i;
        OPJ_FLOAT64 distotarget;                /* fixed_quality */

        /* fixed_quality */
        distotarget = tcd_tile->distotile - ((K * maxSE) / pow((OPJ_FLOAT32)10,
                                             tcd_tcp->distoratio[layno] / 10));

        /* Don't try to find an optimal threshold but rather take everything not included yet, if
          -r xx,yy,zz,0   (disto_alloc == 1 and rates == 0)
          -q xx,yy,zz,0   (fixed_quality == 1 and distoratio == 0)
          ==> possible to have some lossy layers and the last layer for sure lossless */
        if (((cp->m_specific_param.m_enc.m_disto_alloc == 1) &&
                (tcd_tcp->rates[layno] > 0.0f)) ||
                ((cp->m_specific_param.m_enc.m_fixed_quality == 1) &&
                 (tcd_tcp->distoratio[layno] > 0.0))) {
            opj_t2_t*t2 = opj_t2_create(tcd->image, cp);
            OPJ_FLOAT64 thresh = 0;

            if (t2 == 00) {
                return OPJ_FALSE;
            }

            for (i = 0; i < 128; ++i) {
                OPJ_FLOAT64 distoachieved = 0;  /* fixed_quality */

                thresh = (lo + hi) / 2;

                opj_tcd_makelayer(tcd, layno, thresh, 0);

                if (cp->m_specific_param.m_enc.m_fixed_quality) {       /* fixed_quality */
                    if (OPJ_IS_CINEMA(cp->rsiz)) {
                        if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                    p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                    THRESH_CALC, p_manager)) {

                            lo = thresh;
                            continue;
                        } else {
                            distoachieved = layno == 0 ?
                                            tcd_tile->distolayer[0] : cumdisto[layno - 1] + tcd_tile->distolayer[layno];

                            if (distoachieved < distotarget) {
                                hi = thresh;
                                stable_thresh = thresh;
                                continue;
                            } else {
                                lo = thresh;
                            }
                        }
                    } else {
                        distoachieved = (layno == 0) ?
                                        tcd_tile->distolayer[0] : (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);

                        if (distoachieved < distotarget) {
                            hi = thresh;
                            stable_thresh = thresh;
                            continue;
                        }
                        lo = thresh;
                    }
                } else {
                    if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                THRESH_CALC, p_manager)) {
                        /* TODO: what to do with l ??? seek / tell ??? */
                        /* opj_event_msg(tcd->cinfo, EVT_INFO, "rate alloc: len=%d, max=%d\n", l, maxlen); */
                        lo = thresh;
                        continue;
                    }

                    hi = thresh;
                    stable_thresh = thresh;
                }
            }

            goodthresh = stable_thresh == 0 ? thresh : stable_thresh;

            opj_t2_destroy(t2);
        } else {
            /* Special value to indicate to use all passes */
            goodthresh = -1;
        }

        if (cstr_info) { /* Threshold for Marcela Index */
            cstr_info->tile[tcd->tcd_tileno].thresh[layno] = goodthresh;
        }

        opj_tcd_makelayer(tcd, layno, goodthresh, 1);

        /* fixed_quality */
        cumdisto[layno] = (layno == 0) ? tcd_tile->distolayer[0] :
                          (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);
    }

    return OPJ_TRUE;
}